

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int get_physical_address
              (CPURISCVState_conflict1 *env,hwaddr *physical,int *prot,target_ulong addr,
              int access_type,int mmu_idx,_Bool first_stage,_Bool two_stage)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  byte bVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint64_t uVar11;
  MemoryRegion_conflict *pMVar12;
  uint64_t *puVar13;
  uint uVar14;
  target_ulong *ptVar15;
  long lVar16;
  target_ulong addr_00;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  target_ulong tVar21;
  uint64_t uVar22;
  target_ulong local_a0;
  hwaddr vbase;
  int local_88;
  MemTxResult res;
  ulong local_80;
  ulong local_78;
  byte *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  hwaddr *local_50;
  ulong local_48;
  ulong local_40;
  hwaddr addr1;
  
  if (access_type == 2 || mmu_idx != 3) {
    bVar5 = 0;
    uVar17 = mmu_idx;
LAB_00c670a3:
    if ((((access_type != 2) && (uVar17 == 1)) && (uVar17 = 1, (env->misa & 0x80) != 0)) &&
       (((env->virt & 1) == 0 && ((env->hstatus & 1) != 0)))) {
      uVar17 = (uint)env->mstatus >> 8 & 1;
      bVar5 = 1;
    }
  }
  else {
    uVar3 = env->mstatus;
    if (((uint)uVar3 >> 0x11 & 1) != 0) {
      uVar17 = (uint)(uVar3 >> 0xb) & 3;
      if ((env->misa & 0x80) == 0) {
        bVar5 = 0;
      }
      else {
        bVar5 = (byte)(uint)(uVar3 >> 0x27) & 1;
      }
      goto LAB_00c670a3;
    }
    uVar17 = 3;
    bVar5 = 0;
  }
  if (!first_stage) {
    uVar17 = 0;
  }
  if ((uVar17 == 3) || ((env->features & 1) == 0)) {
    *physical = addr;
    *prot = 7;
    return 0;
  }
  ptVar15 = &env->vsstatus;
  if (first_stage) {
    ptVar15 = &env->mstatus;
  }
  *prot = 0;
  uVar3 = *ptVar15;
  if (0x10fff < env->priv_ver) {
    lVar16 = 0x2a0;
    if (bVar5 != 0) {
      lVar16 = 0x368;
    }
    lVar10 = 0x328;
    if (first_stage) {
      lVar10 = lVar16;
    }
    uVar3 = *(ulong *)((long)env->gpr + lVar10);
    if ((uint)(uVar3 >> 0x3c) < 0xb) {
      iVar7 = (*(code *)(&DAT_00dbac4c + *(int *)(&DAT_00dbac4c + (uVar3 >> 0x3c) * 4)))();
      return iVar7;
    }
    iVar7 = 0x17f;
    goto LAB_00c676a2;
  }
  tVar21 = env->sptbr;
  uVar2 = (uint)env->mstatus;
  uVar8 = uVar2 >> 0x18 & 0x1f;
  if (uVar8 < 9) {
    if (uVar8 == 0) {
      *physical = addr;
      *prot = 7;
      return 0;
    }
    if (uVar8 == 8) {
      local_58 = 2;
      iVar7 = 10;
      lVar16 = 4;
      goto LAB_00c6729d;
    }
LAB_00c67688:
    iVar7 = 0x192;
LAB_00c676a2:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
               ,iVar7,(char *)0x0);
  }
  if (uVar8 == 10) {
    local_58 = 4;
  }
  else {
    if (uVar8 != 9) goto LAB_00c67688;
    local_58 = 3;
  }
  iVar7 = 9;
  lVar16 = 8;
LAB_00c6729d:
  cVar4 = (char)local_58 * (sbyte)iVar7;
  uVar20 = ~(-1L << (0x35U - cVar4 & 0x3f));
  uVar19 = addr >> (cVar4 + 0xbU & 0x3f) & uVar20;
  if (uVar19 != 0 && uVar19 != uVar20) {
    return 1;
  }
  uVar14 = ((int)local_58 + -1) * iVar7;
  uVar8 = (uint)(access_type == 1);
  local_68 = (ulong)(access_type == 1) << 7;
  iVar9 = 0;
  local_88 = mmu_idx;
  local_80 = addr;
  local_70 = (byte *)prot;
  local_50 = physical;
  do {
    local_a0 = tVar21 * 0x1000;
    local_78 = (ulong)uVar14;
    local_40 = local_80 >> ((byte)uVar14 + 0xc & 0x3f);
    local_60 = ~(-1L << ((byte)uVar14 & 0x3f));
    while( true ) {
      iVar18 = iVar9;
      uVar19 = (ulong)(~(-1 << (sbyte)iVar7) & (uint)local_40);
      if (first_stage && two_stage) {
        get_physical_address(env,&vbase,(int *)local_70,local_a0,access_type,local_88,false,true);
        addr_00 = uVar19 * lVar16 + vbase;
      }
      else {
        addr_00 = uVar19 * lVar16 + local_a0;
      }
      if (((env->features & 2) != 0) &&
         (_Var6 = pmp_hart_has_privs_riscv64((CPURISCVState_conflict2 *)env,addr_00,8,PMP_READ,1),
         !_Var6)) {
        return 2;
      }
      uVar11 = address_space_ldq_riscv64
                         ((uc_struct_conflict13 *)((AddressSpace *)env[-0x17].gpr[0x1d])->uc,
                          (AddressSpace *)env[-0x17].gpr[0x1d],addr_00,(MemTxAttrs)0x1,&res);
      if (res != 0) {
        return 1;
      }
      if ((uVar11 & 1) == 0) {
        return 1;
      }
      tVar21 = uVar11 >> 10;
      if ((uVar11 & 0xe) == 0) break;
      iVar9 = (int)(uVar11 & 0xe);
      if (iVar9 == 4) {
        return 1;
      }
      if (iVar9 == 0xc) {
        return 1;
      }
      if ((uVar17 == 0) || ((uVar11 & 0x10) == 0)) {
        if ((uVar17 != 1) && ((uVar11 & 0x10) == 0)) {
          return 1;
        }
      }
      else if (access_type == 2 || (uVar2 >> 0x12 & 1) != 0) {
        return 1;
      }
      if ((local_60 & tVar21) != 0) {
        return 1;
      }
      if ((access_type == 0) && ((uVar11 & 2) == 0)) {
        if ((uVar11 & 8) == 0) {
          return 1;
        }
        if ((uVar3 & 0x80000) == 0) {
          return 1;
        }
        local_48 = 0;
        uVar19 = 0;
      }
      else {
        if ((access_type == 1) && ((uVar11 & 4) == 0)) {
          return 1;
        }
        local_48 = (ulong)uVar8;
        uVar19 = local_68;
        if ((access_type == 2) && (local_48 = (ulong)uVar8, (uVar11 & 8) == 0)) {
          return 1;
        }
      }
      uVar19 = uVar19 | uVar11 | 0x40;
      uVar22 = uVar11;
      if (uVar19 == uVar11) goto LAB_00c675e5;
      vbase = 8;
      pMVar12 = flatview_translate_riscv64
                          (*(uc_struct_conflict13 **)(env[-0x17].gpr[0x1d] + 0x30),
                           *(FlatView **)(env[-0x17].gpr[0x1d] + 8),addr_00,&addr1,&vbase,false,
                           (MemTxAttrs)0x1);
      if (pMVar12->ram == false) {
        return 1;
      }
      puVar13 = (uint64_t *)
                qemu_map_ram_ptr_riscv64
                          ((uc_struct_conflict13 *)pMVar12->uc,pMVar12->ram_block,addr1);
      LOCK();
      uVar1 = *puVar13;
      if (uVar11 == uVar1) {
        *puVar13 = uVar19;
      }
      UNLOCK();
      uVar22 = uVar19;
      iVar9 = 0;
      if (uVar11 == uVar1) {
LAB_00c675e5:
        if (iVar18 == 0) {
          local_60 = ~(-1L << ((byte)local_78 & 0x3f));
        }
        *local_50 = (tVar21 | local_60 & local_80 >> 0xc) << 0xc;
        if (((uVar22 & 2) != 0) ||
           (((byte)((uVar22 & 0xffffffff) >> 3) & 0x1f & (byte)(uVar3 >> 0x13) & 1) != 0)) {
          *local_70 = *local_70 | 1;
        }
        if ((uVar22 & 8) != 0) {
          *local_70 = *local_70 | 4;
        }
        if ((uVar22 & 4) == 0) {
          return 0;
        }
        if ((~(byte)local_48 & -1 < (char)uVar22) != 0) {
          return 0;
        }
        *local_70 = *local_70 | 2;
        return 0;
      }
    }
    iVar9 = iVar18 + 1;
    uVar14 = (int)local_78 - iVar7;
    if (iVar9 == (int)local_58) {
      return 1;
    }
  } while( true );
}

Assistant:

static int get_physical_address(CPUM68KState *env, hwaddr *physical,
                                int *prot, target_ulong address,
                                int access_type, target_ulong *page_size)
{
    CPUState *cs = env_cpu(env);
    uint32_t entry;
    uint32_t next;
    target_ulong page_mask;
    bool debug = access_type & ACCESS_DEBUG;
    int page_bits;
    int i;
    MemTxResult txres;

    /* Transparent Translation (physical = logical) */
    for (i = 0; i < M68K_MAX_TTR; i++) {
        if (check_TTR(env->mmu.TTR(access_type, i),
                      prot, address, access_type)) {
            if (access_type & ACCESS_PTEST) {
                /* Transparent Translation Register bit */
                env->mmu.mmusr = M68K_MMU_T_040 | M68K_MMU_R_040;
            }
            *physical = address & TARGET_PAGE_MASK;
            *page_size = TARGET_PAGE_SIZE;
            return 0;
        }
    }

    /* Page Table Root Pointer */
    *prot = PAGE_READ | PAGE_WRITE;
    if (access_type & ACCESS_CODE) {
        *prot |= PAGE_EXEC;
    }
    if (access_type & ACCESS_SUPER) {
        next = env->mmu.srp;
    } else {
        next = env->mmu.urp;
    }

    /* Root Index */
    entry = M68K_POINTER_BASE(next) | M68K_ROOT_INDEX(address);

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }
    if (!M68K_UDT_VALID(next)) {
        return -1;
    }
    if (!(next & M68K_DESC_USED) && !debug) {
        glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                          MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (next & M68K_DESC_WRITEPROT) {
        if (access_type & ACCESS_PTEST) {
            env->mmu.mmusr |= M68K_MMU_WP_040;
        }
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }

    /* Pointer Index */
    entry = M68K_POINTER_BASE(next) | M68K_POINTER_INDEX(address);

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }
    if (!M68K_UDT_VALID(next)) {
        return -1;
    }
    if (!(next & M68K_DESC_USED) && !debug) {
        glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                          MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (next & M68K_DESC_WRITEPROT) {
        if (access_type & ACCESS_PTEST) {
            env->mmu.mmusr |= M68K_MMU_WP_040;
        }
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }

    /* Page Index */
    if (env->mmu.tcr & M68K_TCR_PAGE_8K) {
        entry = M68K_8K_PAGE_BASE(next) | M68K_8K_PAGE_INDEX(address);
    } else {
        entry = M68K_4K_PAGE_BASE(next) | M68K_4K_PAGE_INDEX(address);
    }

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }

    if (!M68K_PDT_VALID(next)) {
        return -1;
    }
    if (M68K_PDT_INDIRECT(next)) {
        next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, M68K_INDIRECT_POINTER(next),
                                 MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (access_type & ACCESS_STORE) {
        if (next & M68K_DESC_WRITEPROT) {
            if (!(next & M68K_DESC_USED) && !debug) {
                glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                                  MEMTXATTRS_UNSPECIFIED, &txres);
                if (txres != MEMTX_OK) {
                    goto txfail;
                }
            }
        } else if ((next & (M68K_DESC_MODIFIED | M68K_DESC_USED)) !=
                           (M68K_DESC_MODIFIED | M68K_DESC_USED) && !debug) {
            glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry,
                              next | (M68K_DESC_MODIFIED | M68K_DESC_USED),
                              MEMTXATTRS_UNSPECIFIED, &txres);
            if (txres != MEMTX_OK) {
                goto txfail;
            }
        }
    } else {
        if (!(next & M68K_DESC_USED) && !debug) {
            glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                              MEMTXATTRS_UNSPECIFIED, &txres);
            if (txres != MEMTX_OK) {
                goto txfail;
            }
        }
    }

    if (env->mmu.tcr & M68K_TCR_PAGE_8K) {
        page_bits = 13;
    } else {
        page_bits = 12;
    }
    *page_size = 1 << page_bits;
    page_mask = ~(*page_size - 1);
    *physical = next & page_mask;

    if (access_type & ACCESS_PTEST) {
        env->mmu.mmusr |= next & M68K_MMU_SR_MASK_040;
        env->mmu.mmusr |= *physical & 0xfffff000;
        env->mmu.mmusr |= M68K_MMU_R_040;
    }

    if (next & M68K_DESC_WRITEPROT) {
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }
    if (next & M68K_DESC_SUPERONLY) {
        if ((access_type & ACCESS_SUPER) == 0) {
            return -1;
        }
    }

    return 0;

txfail:
    /*
     * A page table load/store failed. TODO: we should really raise a
     * suitable guest fault here if this is not a debug access.
     * For now just return that the translation failed.
     */
    return -1;
}